

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall
ExprFactoryTest_ExprMemoryAllocation_Test::~ExprFactoryTest_ExprMemoryAllocation_Test
          (ExprFactoryTest_ExprMemoryAllocation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExprFactoryTest, ExprMemoryAllocation) {
  MockAllocator alloc;
  mp::BasicExprFactory< AllocatorRef<> > f((AllocatorRef<>(&alloc)));
  char buffer[100];
  EXPECT_CALL(alloc, allocate(_)).WillOnce(Return(buffer));
  f.MakeNumericConstant(42);
  EXPECT_CALL(alloc, deallocate(buffer, _));
}